

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O3

void __thiscall tvm::runtime::WorkspacePool::Pool::Free(Pool *this,void *data)

{
  pointer *ppEVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  iterator __position;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  ostream *poVar9;
  pointer pEVar10;
  long lVar11;
  pointer pEVar12;
  pointer __src;
  long lVar13;
  long lVar14;
  uint uVar15;
  LogCheckError _check_err;
  Entry e;
  LogCheckError local_1c0;
  Entry local_1b8;
  int local_1a4;
  LogMessageFatal local_1a0;
  
  pEVar10 = (this->allocated_).
            super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar10[-1].data == data) {
    pEVar12 = pEVar10 + -1;
    local_1b8.data = pEVar12->data;
    local_1b8.size = pEVar10[-1].size;
  }
  else {
    pEVar12 = (this->allocated_).
              super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = (int)((ulong)((long)pEVar10 - (long)pEVar12) >> 4);
    uVar15 = iVar5 - 2;
    if (2 < iVar5) {
      do {
        if (pEVar12[uVar15].data == data) goto LAB_0010a7d6;
        bVar4 = 1 < (int)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar4);
      uVar15 = 0;
    }
LAB_0010a7d6:
    local_1a4 = 0;
    local_1a0._0_4_ = uVar15;
    dmlc::LogCheck_GT<int,int>((dmlc *)&local_1c0,(int *)&local_1a0,&local_1a4);
    if (local_1c0.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"Check failed: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"index > 0",9);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,((local_1c0.str)->_M_dataplus)._M_p,
                          (local_1c0.str)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"trying to free things that has not been allocated",0x31);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
    }
    dmlc::LogCheckError::~LogCheckError(&local_1c0);
    pEVar3 = (this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar10 = pEVar3 + (int)uVar15;
    __src = pEVar10 + 1;
    local_1b8.data = pEVar10->data;
    local_1b8.size = pEVar10->size;
    pEVar12 = (this->allocated_).
              super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (__src != pEVar12) {
      memmove(pEVar3 + (int)uVar15,__src,(long)pEVar12 - (long)__src);
      pEVar12 = (this->allocated_).
                super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    pEVar12 = pEVar12 + -1;
  }
  sVar6 = local_1b8.size;
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = pEVar12;
  __position._M_current =
       (this->free_list_).
       super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current[-1].size < local_1b8.size) {
    if (__position._M_current ==
        (this->free_list_).
        super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
      ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
                ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
                  *)this,__position,&local_1b8);
    }
    else {
      (__position._M_current)->data = local_1b8.data;
      (__position._M_current)->size = local_1b8.size;
      ppEVar1 = &(this->free_list_).
                 super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
  }
  else {
    lVar14 = (long)__position._M_current -
             (long)(this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 == 0x20) {
      if (__position._M_current ==
          (this->free_list_).
          super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
        ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
                  ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
                    *)this,__position,__position._M_current + -1);
      }
      else {
        sVar6 = __position._M_current[-1].size;
        (__position._M_current)->data = __position._M_current[-1].data;
        (__position._M_current)->size = sVar6;
        ppEVar1 = &(this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      pEVar10 = (this->free_list_).
                super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar10[1].data = local_1b8.data;
      pEVar10[1].size = local_1b8.size;
    }
    else {
      lVar14 = lVar14 >> 4;
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ::resize(&this->free_list_,lVar14 + 1);
      lVar11 = lVar14 + -1;
      pEVar10 = (this->free_list_).
                super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (sVar6 < pEVar10[lVar11].size) {
        pEVar12 = pEVar10 + lVar11;
        lVar13 = lVar14 << 4;
        do {
          sVar7 = pEVar12->size;
          puVar2 = (undefined8 *)((long)&pEVar10->data + lVar13);
          *puVar2 = pEVar12->data;
          puVar2[1] = sVar7;
          lVar11 = lVar11 + -1;
          pEVar10 = (this->free_list_).
                    super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pEVar12 = pEVar10 + lVar11;
          lVar14 = lVar14 + -1;
          lVar8 = lVar13 + -0x18;
          lVar13 = lVar13 + -0x10;
        } while (sVar6 < *(ulong *)((long)pEVar10 + lVar8));
      }
      pEVar10[lVar14].data = local_1b8.data;
      pEVar10[lVar14].size = local_1b8.size;
    }
  }
  return;
}

Assistant:

void Free(void *data) {
    Entry e;
    if (allocated_.back().data == data) {
      // quick path, last allocated.
      e = allocated_.back();
      allocated_.pop_back();
    } else {
      int index = static_cast<int>(allocated_.size()) - 2;
      for (; index > 0 && allocated_[index].data != data; --index) {
      }
      CHECK_GT(index, 0) << "trying to free things that has not been allocated";
      e = allocated_[index];
      allocated_.erase(allocated_.begin() + index);
    }
    if (free_list_.back().size < e.size) {
      free_list_.push_back(e);
    } else if (free_list_.size() == 2) {
      free_list_.push_back(free_list_.back());
      free_list_[1] = e;
    } else {
      size_t i = free_list_.size() - 1;
      free_list_.resize(free_list_.size() + 1);
      for (; e.size < free_list_[i].size; --i) {
        free_list_[i + 1] = free_list_[i];
      }
      free_list_[i + 1] = e;
    }
  }